

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O0

void __thiscall
OpenNN::NeuralNetwork::train(NeuralNetwork *this,int epochs,MatrixXd *inputs,MatrixXd *targets)

{
  Index *this_00;
  int index;
  Index IVar1;
  ostream *poVar2;
  long lVar3;
  Index IVar4;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *pMVar5;
  size_type sVar6;
  Layer *pLVar7;
  MatrixXd *pMVar8;
  reference ppMVar9;
  void *this_01;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar10;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_260;
  undefined1 local_248 [8];
  MatrixXd current_weights;
  undefined1 local_228 [8];
  MatrixXd delta_weights_transposed;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_208;
  undefined1 local_1f8 [8];
  MatrixXd delta_weights;
  MatrixXd teste;
  undefined1 local_1b0 [8];
  MatrixXd gradients;
  MatrixXd current_values;
  Layer *current_layer;
  int first_hidden_layer_index;
  int output_layer_index;
  Matrix<double,__1,__1,_0,__1,__1> local_158;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_140;
  undefined1 local_128 [8];
  MatrixXd error;
  undefined1 local_f8 [8];
  MatrixXd output;
  RowXpr local_d0;
  undefined1 local_98 [8];
  MatrixXd target;
  undefined1 local_48 [8];
  MatrixXd input;
  int i;
  int epoch;
  MatrixXd *targets_local;
  MatrixXd *inputs_local;
  int epochs_local;
  NeuralNetwork *this_local;
  
  if (epochs != 0) {
    IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)inputs);
    if (IVar1 != 0) {
      IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)targets);
      if (IVar1 != 0) {
        for (input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             ._4_4_ = 0;
            input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
            _4_4_ < epochs;
            input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
            _4_4_ = input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                    .m_cols._4_4_ + 1) {
          input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
          _0_4_ = 0;
          while( true ) {
            lVar3 = (long)(int)input.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols;
            IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                              (&inputs->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
            if (IVar4 <= lVar3) break;
            this_00 = &target.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols;
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                      ((RowXpr *)this_00,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)inputs,
                       (long)(int)input.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols);
            pMVar5 = Eigen::
                     MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                     ::matrix((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                               *)this_00);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_48,
                       (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                        *)pMVar5);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                      (&local_d0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)targets,
                       (long)(int)input.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols);
            pMVar5 = Eigen::
                     MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                     ::matrix((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                               *)&local_d0);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_98,
                       (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                        *)pMVar5);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       &error.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,(Matrix<double,__1,__1,_0,__1,__1> *)local_48);
            predict((MatrixXd *)local_f8,this,
                    (MatrixXd *)
                    &error.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       &error.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                      (&local_140,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_f8,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_98);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_128,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_140);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                      (&local_158,(Matrix<double,__1,__1,_0,__1,__1> *)local_f8);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&first_hidden_layer_index,
                       (Matrix<double,__1,__1,_0,__1,__1> *)local_98);
            calculate_error(this,&local_158,(MatrixXd *)&first_hidden_layer_index);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&first_hidden_layer_index);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_158);
            sVar6 = std::vector<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>::size
                              (&this->network_layers);
            index = (int)sVar6 + -2;
            pLVar7 = get_layer(this,(int)sVar6 + -1);
            pMVar8 = Layer::to_matrix_derivated(pLVar7);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       &gradients.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,pMVar8);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            cwiseProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)&teste.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols,
                       (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_128,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &gradients.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_1b0,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&teste.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols);
            pLVar7 = get_layer(this,index);
            pMVar8 = Layer::to_matrix_activated(pLVar7);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       &delta_weights.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,pMVar8);
            delta_weights_transposed.
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
                 (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b0
                                  );
            PVar10 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                     operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                               &delta_weights_transposed.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols,
                               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                               &delta_weights.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols);
            local_208 = PVar10;
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_1f8,
                       (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                        *)&local_208);
            current_weights.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols =
                 (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f8
                                  );
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_228,
                       (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                       &current_weights.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            ppMVar9 = std::
                      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                      ::at(&this->weight_matrices,(long)index);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_248,*ppMVar9);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                      (&local_260,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_248,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_228);
            ppMVar9 = std::
                      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                      ::at(&this->weight_matrices,(long)index);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                      ((Matrix<double,_1,_1,0,_1,_1> *)*ppMVar9,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_260);
            poVar2 = std::operator<<((ostream *)&std::cout,"Current Weights: ");
            poVar2 = (ostream *)
                     std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               *)local_248);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar2 = std::operator<<((ostream *)&std::cout,"Delta Weights: ");
            poVar2 = (ostream *)
                     std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               *)local_228);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar2 = std::operator<<((ostream *)&std::cout,"Updated Weights: ");
            poVar2 = (ostream *)
                     std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            ppMVar9 = std::
                      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                      ::at(&this->weight_matrices,(long)index);
            poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               *)*ppMVar9);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar2 = std::operator<<((ostream *)&std::cout,"=====================================");
            this_01 = (void *)std::ostream::operator<<
                                        (poVar2,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_248);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_228);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_1f8);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       &delta_weights.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_1b0);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       &gradients.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_128);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_f8);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_98);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_48);
            input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
            _0_4_ = (int)input.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols + 1;
          }
        }
        return;
      }
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Missing train data!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/M4urici0GM[P]Perceptron/src/NeuralNetwork/NeuralNetwork.cpp"
                ,0x5c,"void OpenNN::NeuralNetwork::train(int, Eigen::MatrixXd, Eigen::MatrixXd)");
}

Assistant:

void OpenNN::NeuralNetwork::train(int epochs, Eigen::MatrixXd inputs, Eigen::MatrixXd targets)
{
    if (epochs == 0 || inputs.size() == 0 || targets.size() == 0)
    {
        std::cerr << "Missing train data!" << std::endl;
        assert(false);
    }

    for (int epoch = 0; epoch < epochs; epoch++)
    {
        for (int i = 0; i < inputs.rows(); i++)
        {
            Eigen::MatrixXd input = inputs.row(i).matrix();
            Eigen::MatrixXd target = targets.row(i).matrix();

            Eigen::MatrixXd output = this->predict(input);

            Eigen::MatrixXd error = (output - target);

            this->calculate_error(output, target);

            int output_layer_index = (this->network_layers.size() - 1);
            int first_hidden_layer_index = (output_layer_index - 1);

            /**
             * Output to the firt hidden
             * ----------------------------------
             * */
            Layer* current_layer = this->get_layer(output_layer_index);
            Eigen::MatrixXd current_values = *current_layer->to_matrix_derivated();

            //Calculate the gradient of current layer
            Eigen::MatrixXd gradients = error.cwiseProduct(current_values);
            // gradients *= this->learning_rate;

            /**
             * Multiply the transposed version of the gradient matrix by the output of the previous layer 
             * and transpose it
             * */
            auto teste = *this->get_layer(first_hidden_layer_index)->to_matrix_activated();
            

            Eigen::MatrixXd delta_weights = gradients.transpose() * teste;
            Eigen::MatrixXd delta_weights_transposed = delta_weights.transpose();

            /**
             * Get the weights between the previous layer and the current one
             * */
            Eigen::MatrixXd current_weights = *this->weight_matrices.at(first_hidden_layer_index);

            /**
             * Subtract the current weights by the delta weight
             * */


            /**
             * Update the weights with the new one
             * */
            *this->weight_matrices.at(first_hidden_layer_index) = (current_weights - delta_weights_transposed);


            std::cout << "Current Weights: " << std::endl << current_weights << std::endl;
            std::cout << "Delta Weights: " << std::endl << delta_weights_transposed << std::endl;
            std::cout << "Updated Weights: " << std::endl << *this->weight_matrices.at(first_hidden_layer_index) << std::endl;
            std::cout << "=====================================" << std::endl << std::endl;
        }   
    }
}